

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::JoinDefines
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,string *definesString,string *lang)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  char *pcVar3;
  cmOutputConverter *this_00;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  byte *pbVar6;
  char cVar7;
  allocator local_d9;
  cmLocalGenerator *local_d8;
  string *local_d0;
  char *local_c8;
  string defineFlagVar;
  string local_90;
  string dflag;
  string local_50;
  
  local_d8 = this;
  local_d0 = definesString;
  std::__cxx11::string::string((string *)&dflag,"-D",(allocator *)&defineFlagVar);
  if (lang->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&defineFlagVar,"CMAKE_",(allocator *)&local_90);
    std::__cxx11::string::append((string *)&defineFlagVar);
    std::__cxx11::string::append((char *)&defineFlagVar);
    pcVar3 = cmMakefile::GetDefinition(local_d8->Makefile,&defineFlagVar);
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      std::__cxx11::string::assign((char *)&dflag);
    }
    std::__cxx11::string::~string((string *)&defineFlagVar);
  }
  p_Var5 = (defines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8 = "";
  if (local_d0->_M_string_length != 0) {
    local_c8 = " ";
  }
  this_00 = &local_d8->super_cmOutputConverter;
  while( true ) {
    if ((_Rb_tree_header *)p_Var5 == &(defines->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::~string((string *)&dflag);
      return;
    }
    std::__cxx11::string::string((string *)&defineFlagVar,(string *)&dflag);
    bVar2 = cmState::UseWatcomWMake(local_d8->GlobalGenerator->CMakeInstance->State);
    p_Var1 = p_Var5 + 1;
    if (bVar2) break;
    lVar4 = std::__cxx11::string::find((char *)p_Var1,0x533850);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)p_Var1);
    std::__cxx11::string::append((string *)&defineFlagVar);
    std::__cxx11::string::~string((string *)&local_90);
    if (lVar4 != -1) {
      std::__cxx11::string::append((char *)&defineFlagVar);
      std::__cxx11::string::string
                ((string *)&local_50,(char *)(*(long *)p_Var1 + lVar4 + 1),&local_d9);
      cmOutputConverter::EscapeForShell(&local_90,this_00,&local_50,true,false,false);
      std::__cxx11::string::append((string *)&defineFlagVar);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
LAB_003c85a7:
    std::__cxx11::string::append((char *)local_d0);
    std::__cxx11::string::append((string *)local_d0);
    std::__cxx11::string::~string((string *)&defineFlagVar);
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    local_c8 = " ";
  }
  pbVar6 = *(byte **)p_Var1;
  do {
    cVar7 = (char)&defineFlagVar;
    if (*pbVar6 - 0x23 < 2) {
      std::__cxx11::string::push_back(cVar7);
    }
    else if (*pbVar6 == 0) goto LAB_003c85a7;
    std::__cxx11::string::push_back(cVar7);
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

void cmLocalGenerator::JoinDefines(const std::set<std::string>& defines,
                                   std::string& definesString,
                                   const std::string& lang)
{
  // Lookup the define flag for the current language.
  std::string dflag = "-D";
  if (!lang.empty()) {
    std::string defineFlagVar = "CMAKE_";
    defineFlagVar += lang;
    defineFlagVar += "_DEFINE_FLAG";
    const char* df = this->Makefile->GetDefinition(defineFlagVar);
    if (df && *df) {
      dflag = df;
    }
  }

  std::set<std::string>::const_iterator defineIt = defines.begin();
  const std::set<std::string>::const_iterator defineEnd = defines.end();
  const char* itemSeparator = definesString.empty() ? "" : " ";
  for (; defineIt != defineEnd; ++defineIt) {
    // Append the definition with proper escaping.
    std::string def = dflag;
    if (this->GetState()->UseWatcomWMake()) {
      // The Watcom compiler does its own command line parsing instead
      // of using the windows shell rules.  Definitions are one of
      //   -DNAME
      //   -DNAME=<cpp-token>
      //   -DNAME="c-string with spaces and other characters(?@#$)"
      //
      // Watcom will properly parse each of these cases from the
      // command line without any escapes.  However we still have to
      // get the '$' and '#' characters through WMake as '$$' and
      // '$#'.
      for (const char* c = defineIt->c_str(); *c; ++c) {
        if (*c == '$' || *c == '#') {
          def += '$';
        }
        def += *c;
      }
    } else {
      // Make the definition appear properly on the command line.  Use
      // -DNAME="value" instead of -D"NAME=value" for historical reasons.
      std::string::size_type eq = defineIt->find("=");
      def += defineIt->substr(0, eq);
      if (eq != std::string::npos) {
        def += "=";
        def += this->EscapeForShell(defineIt->c_str() + eq + 1, true);
      }
    }
    definesString += itemSeparator;
    itemSeparator = " ";
    definesString += def;
  }
}